

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void reallymarkobject(global_State *g,GCObject *o)

{
  lu_byte lVar1;
  byte bVar2;
  GCObject *pGVar3;
  Udata *iu;
  
  bVar2 = o->marked;
  while( true ) {
    bVar2 = bVar2 & 0xfc;
    o->marked = bVar2;
    lVar1 = o->tt;
    if (lVar1 != '\a') break;
    pGVar3 = o[1].next;
    if ((pGVar3 != (GCObject *)0x0) && ((pGVar3->marked & 3) != 0)) {
      reallymarkobject(g,pGVar3);
      bVar2 = o->marked;
    }
    o->marked = bVar2 | 4;
    g->GCmemtrav = *(long *)&o[1].tt + g->GCmemtrav + 0x28;
    if ((o->field_0xa & 0x40) == 0) {
      return;
    }
    o = o[2].next;
    bVar2 = o->marked;
    if ((bVar2 & 3) == 0) {
      return;
    }
  }
  switch(lVar1) {
  case '\x04':
    o->marked = bVar2 | 4;
    pGVar3 = (GCObject *)(ulong)(byte)o->field_0xb;
LAB_0011b50f:
    g->GCmemtrav = (lu_mem)(&pGVar3[1].marked + g->GCmemtrav);
    return;
  case '\x05':
    o[3].next = g->gray;
    break;
  case '\a':
    return;
  case '\b':
    *(GCObject **)&o[4].tt = g->gray;
    break;
  case '\t':
    o[7].next = g->gray;
    break;
  default:
    if (lVar1 == '\x14') {
      o->marked = bVar2 | 4;
      pGVar3 = o[1].next;
      goto LAB_0011b50f;
    }
    if (lVar1 != '&') {
      return;
    }
  case '\x06':
    o[1].next = g->gray;
  }
  g->gray = o;
  return;
}

Assistant:

static void reallymarkobject (global_State *g, GCObject *o) {
  white2gray(o);
  switch (o->tt) {
    case LUA_VSHRSTR:
    case LUA_VLNGSTR: {
      gray2black(o);
      break;
    }
    case LUA_VUPVAL: {
      UpVal *uv = gco2upv(o);
      if (!upisopen(uv))  /* open upvalues are kept gray */
        gray2black(o);
      markvalue(g, uv->v);  /* mark its content */
      break;
    }
    case LUA_VUSERDATA: {
      Udata *u = gco2u(o);
      if (u->nuvalue == 0) {  /* no user values? */
        markobjectN(g, u->metatable);  /* mark its metatable */
        gray2black(o);  /* nothing else to mark */
        break;
      }
      /* else... */
    }  /* FALLTHROUGH */
    case LUA_VLCL: case LUA_VCCL: case LUA_VTABLE:
    case LUA_VTHREAD: case LUA_VPROTO: {
      linkobjgclist(o, g->gray);
      break;
    }
    default: lua_assert(0); break;
  }
}